

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O2

void pzshape::TPZShapePrism::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  double *pdVar18;
  int64_t row;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long row_00;
  double dVar22;
  double local_b0;
  double local_a8;
  TPZStack<int,_10> highsides;
  
  lVar20 = 6;
  do {
    if (lVar20 == 0x15) {
      for (lVar20 = 6; lVar20 != 0x15; lVar20 = lVar20 + 1) {
        if (0 < nshape->fStore[lVar20 + -6]) {
          TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&highsides.super_TPZManVector<int,_10>);
          pztopology::TPZPrism::HigherDimensionSides
                    ((int)lVar20,(TPZStack<int,_10> *)&highsides.super_TPZManVector<int,_10>);
          uVar15 = (uint)highsides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
          if ((int)(uint)highsides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements < 1) {
            uVar15 = 0;
          }
          for (uVar19 = 0; uVar15 != uVar19; uVar19 = uVar19 + 1) {
            iVar16 = highsides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[uVar19];
            iVar17 = pztopology::TPZPrism::NSideNodes(iVar16);
            if (iVar17 == 4) {
              lVar21 = (long)iVar16;
              pdVar18 = TPZFMatrix<double>::operator()(phi,lVar21,0);
              dVar22 = *pdVar18;
              pdVar18 = TPZFMatrix<double>::operator()(phi,lVar20,0);
              *pdVar18 = dVar22 + *pdVar18;
              pdVar18 = TPZFMatrix<double>::operator()(dphi,0,lVar21);
              dVar22 = *pdVar18;
              pdVar18 = TPZFMatrix<double>::operator()(dphi,0,lVar20);
              *pdVar18 = dVar22 + *pdVar18;
              pdVar18 = TPZFMatrix<double>::operator()(dphi,1,lVar21);
              dVar22 = *pdVar18;
              pdVar18 = TPZFMatrix<double>::operator()(dphi,1,lVar20);
              *pdVar18 = dVar22 + *pdVar18;
              pdVar18 = TPZFMatrix<double>::operator()(dphi,2,lVar21);
              dVar22 = *pdVar18;
              pdVar18 = TPZFMatrix<double>::operator()(dphi,2,lVar20);
              *pdVar18 = dVar22 + *pdVar18;
            }
          }
          TPZManVector<int,_10>::~TPZManVector(&highsides.super_TPZManVector<int,_10>);
        }
      }
      for (lVar20 = 6; lVar20 != 0x15; lVar20 = lVar20 + 1) {
        if (0 < nshape->fStore[lVar20 + -6]) {
          dVar22 = *(double *)(&DAT_0130a240 + lVar20 * 8);
          pdVar18 = TPZFMatrix<double>::operator()(phi,lVar20,0);
          *pdVar18 = *pdVar18 * dVar22;
          pdVar18 = TPZFMatrix<double>::operator()(dphi,0,lVar20);
          *pdVar18 = *pdVar18 * dVar22;
          pdVar18 = TPZFMatrix<double>::operator()(dphi,1,lVar20);
          *pdVar18 = *pdVar18 * dVar22;
          pdVar18 = TPZFMatrix<double>::operator()(dphi,2,lVar20);
          *pdVar18 = dVar22 * *pdVar18;
        }
      }
      return;
    }
    iVar17 = (int)lVar20;
    iVar16 = pztopology::TPZPrism::NSideNodes(iVar17);
    switch(iVar16) {
    case 2:
      if (0 < nshape->fStore[lVar20 + -6]) {
        iVar16 = pztopology::TPZPrism::SideNodeLocId(iVar17,0);
        iVar17 = pztopology::TPZPrism::SideNodeLocId(iVar17,1);
        lVar21 = (long)iVar16;
        pdVar18 = TPZFMatrix<double>::operator()(phi,lVar21,0);
        dVar22 = *pdVar18;
        row = (int64_t)iVar17;
        pdVar18 = TPZFMatrix<double>::operator()(phi,row,0);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        *pdVar18 = dVar22 * dVar4;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,0,lVar21);
        dVar22 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,row,0);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,lVar21,0);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,0,row);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,0,lVar20);
        *pdVar18 = dVar5 * dVar6 + dVar22 * dVar4;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,1,lVar21);
        local_b0 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,row,0);
        local_b0 = local_b0 * *pdVar18;
        goto LAB_00f6012d;
      }
      break;
    case 3:
      if (0 < nshape->fStore[lVar20 + -6]) {
        lVar21 = (ulong)(lVar20 == 0x13) * 3 + 2;
        pdVar18 = TPZFMatrix<double>::operator()(phi,0,0);
        dVar22 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,3,0);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,1,0);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,4,0);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,lVar21,0);
        dVar7 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        *pdVar18 = (dVar5 + dVar6) * (dVar22 + dVar4) * dVar7;
        for (row_00 = 0; row_00 != 3; row_00 = row_00 + 1) {
          pdVar18 = TPZFMatrix<double>::operator()(dphi,row_00,0);
          dVar22 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(dphi,row_00,3);
          dVar4 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(phi,1,0);
          dVar5 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(phi,4,0);
          dVar6 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar7 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(phi,0,0);
          dVar8 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(phi,3,0);
          dVar9 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(dphi,row_00,1);
          dVar10 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(dphi,row_00,4);
          dVar11 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(phi,lVar21,0);
          dVar12 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(phi,0,0);
          dVar13 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(phi,3,0);
          dVar14 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(phi,1,0);
          dVar1 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(phi,4,0);
          dVar2 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(dphi,row_00,lVar21);
          dVar3 = *pdVar18;
          pdVar18 = TPZFMatrix<double>::operator()(dphi,row_00,lVar20);
          *pdVar18 = (dVar1 + dVar2) * (dVar13 + dVar14) * dVar3 +
                     (dVar10 + dVar11) * (dVar8 + dVar9) * dVar12 +
                     (dVar5 + dVar6) * (dVar22 + dVar4) * dVar7;
        }
      }
      break;
    case 4:
      iVar16 = pztopology::TPZPrism::SideNodeLocId(iVar17,0);
      iVar17 = pztopology::TPZPrism::SideNodeLocId(iVar17,2);
      lVar21 = (long)iVar16;
      pdVar18 = TPZFMatrix<double>::operator()(phi,lVar21,0);
      dVar22 = *pdVar18;
      row = (int64_t)iVar17;
      pdVar18 = TPZFMatrix<double>::operator()(phi,row,0);
      dVar4 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()(phi,lVar20,0);
      *pdVar18 = dVar22 * dVar4;
      pdVar18 = TPZFMatrix<double>::operator()(dphi,0,lVar21);
      dVar22 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()(phi,row,0);
      dVar4 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()(phi,lVar21,0);
      dVar5 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()(dphi,0,row);
      dVar6 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()(dphi,0,lVar20);
      *pdVar18 = dVar5 * dVar6 + dVar22 * dVar4;
      pdVar18 = TPZFMatrix<double>::operator()(dphi,1,lVar21);
      local_b0 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()(phi,row,0);
      local_b0 = local_b0 * *pdVar18;
LAB_00f6012d:
      pdVar18 = TPZFMatrix<double>::operator()(phi,lVar21,0);
      dVar22 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()(dphi,1,row);
      dVar4 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()(dphi,1,lVar20);
      *pdVar18 = dVar22 * dVar4 + local_b0;
      pdVar18 = TPZFMatrix<double>::operator()(dphi,2,lVar21);
      local_a8 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()(phi,row,0);
      local_a8 = local_a8 * *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()(phi,lVar21,0);
      dVar22 = *pdVar18;
      pdVar18 = TPZFMatrix<double>::operator()(dphi,2,row);
      dVar22 = dVar22 * *pdVar18;
LAB_00f60993:
      pdVar18 = TPZFMatrix<double>::operator()(dphi,2,lVar20);
      *pdVar18 = dVar22 + local_a8;
      break;
    case 6:
      if (0 < nshape->fStore[lVar20 + -6]) {
        pdVar18 = TPZFMatrix<double>::operator()(phi,0,0);
        dVar22 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,4,0);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,2,0);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,5,0);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        *pdVar18 = (dVar5 + dVar6) * dVar22 * dVar4;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,0,0);
        dVar22 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,4,0);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,2,0);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,5,0);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,0,0);
        dVar7 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,0,4);
        dVar8 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,2,0);
        dVar9 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,5,0);
        dVar10 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,0,0);
        dVar11 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,4,0);
        dVar12 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,0,2);
        dVar13 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,0,5);
        dVar14 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,0,lVar20);
        *pdVar18 = (dVar13 + dVar14) * dVar11 * dVar12 +
                   (dVar9 + dVar10) * dVar7 * dVar8 + (dVar5 + dVar6) * dVar22 * dVar4;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,1,0);
        dVar22 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,4,0);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,2,0);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,5,0);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,0,0);
        dVar7 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,1,4);
        dVar8 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,2,0);
        dVar9 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,5,0);
        dVar10 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,0,0);
        dVar11 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,4,0);
        dVar12 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,1,2);
        dVar13 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,1,5);
        dVar14 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,1,lVar20);
        *pdVar18 = (dVar13 + dVar14) * dVar11 * dVar12 +
                   (dVar9 + dVar10) * dVar7 * dVar8 + (dVar5 + dVar6) * dVar22 * dVar4;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,2,0);
        dVar22 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,4,0);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,2,0);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,5,0);
        dVar6 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,0,0);
        dVar7 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,2,4);
        dVar8 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,2,0);
        dVar9 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,5,0);
        local_a8 = (dVar9 + *pdVar18) * dVar7 * dVar8 + (dVar5 + dVar6) * dVar22 * dVar4;
        pdVar18 = TPZFMatrix<double>::operator()(phi,0,0);
        dVar22 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(phi,4,0);
        dVar4 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,2,2);
        dVar5 = *pdVar18;
        pdVar18 = TPZFMatrix<double>::operator()(dphi,2,5);
        dVar22 = (dVar5 + *pdVar18) * dVar22 * dVar4;
        goto LAB_00f60993;
      }
    }
    lVar20 = lVar20 + 1;
  } while( true );
}

Assistant:

void TPZShapePrism::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
    {
        int is;
        // 9 ribs
        for(is=6; is<NSides; is++)
        {
            int nsnodes = NSideNodes(is);
            switch(nsnodes)
            {
                case 2:
                {
                    if(nshape[is-6] < 1) continue;
                    int is1 = SideNodeLocId(is,0);
                    int is2 = SideNodeLocId(is,1);
                    phi(is,0) = phi(is1,0)*phi(is2,0);
                    dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
                    dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
                    dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
                }
                    break;
                case 3:
                {
                    if(nshape[is-6] < 1) continue;
                    int is0 = 0;
                    int is1 = 1;
                    int is2 = 2;
                    int is3 = 3;
                    int is4 = 4;
                    if(is == 19)
                    {
                        is2 = 5;
                    }
                    phi(is,0) = (phi(is0,0)+phi(is3,0))*(phi(is1,0)+phi(is4,0))*phi(is2,0);
                    int d;
                    for(d=0; d<3; d++)
                    {
                        dphi(d,is) =
                        (dphi(d,is0)+dphi(d,is3))*(phi(is1,0)+phi(is4,0))*phi(is2,0) +
                        (phi(is0,0)+phi(is3,0))*(dphi(d,is1)+dphi(d,is4))*phi(is2,0) +
                        (phi(is0,0)+phi(is3,0))*(phi(is1,0)+phi(is4,0))*dphi(d,is2);
                    }
                }
                    break;
                case 4:
                {
                    int is1 = SideNodeLocId(is,0);
                    int is2 = SideNodeLocId(is,2);
                    phi(is,0) = phi(is1,0)*phi(is2,0);
                    dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
                    dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
                    dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
                }
                    break;
                case 6:
                {
                    if(nshape[is-6] < 1) continue;
                    int is1 = 0;
                    int is2 = 4;
                    int is3 = 2;
                    int is4 = 5;
                    phi(is,0) = phi(is1,0)*phi(is2,0)*(phi(is3,0)+phi(is4,0));
                    dphi(0,is) = dphi(0,is1)*phi(is2,0)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*dphi(0,is2)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*phi(is2,0)*(dphi(0,is3)+dphi(0,is4));
                    dphi(1,is) = dphi(1,is1)*phi(is2,0)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*dphi(1,is2)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*phi(is2,0)*(dphi(1,is3)+dphi(1,is4));
                    dphi(2,is) = dphi(2,is1)*phi(is2,0)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*dphi(2,is2)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*phi(is2,0)*(dphi(2,is3)+dphi(2,is4));
                }
                    break;
                default:
                    ;
            }
        }
        // Make the generating shape functions linear and unitary
        for(is=6; is<NSides; is++)
        {
            if(nshape[is-6] < 1) continue;
            TPZStack<int> highsides;
            HigherDimensionSides(is,highsides);
            int h, nh = highsides.NElements();
            for(h=0; h<nh; h++)
            {
                int hs = highsides[h];
                if(NSideNodes(hs) != 4) continue;
                phi(is,0) += phi(hs,0);
                dphi(0,is) += dphi(0,hs);
                dphi(1,is) += dphi(1,hs);
                dphi(2,is) += dphi(2,hs);
            }
        }
        REAL mult[] = {1.,1.,1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,4.,4.,4.,27.,16.,16.,16.,27.,8.};
        for(is=6;is<NSides; is++)
        {
            if(nshape[is-6] < 1) continue;
            phi(is,0) *= mult[is];
            dphi(0,is) *= mult[is];
            dphi(1,is) *= mult[is];
            dphi(2,is) *= mult[is];
        }
        
    }